

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

void __thiscall spvtools::opt::analysis::Opaque::Opaque(Opaque *this,Opaque *param_1)

{
  pointer pcVar1;
  
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Type_00b16068;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&(this->super_Type).decorations_,&(param_1->super_Type).decorations_);
  (this->super_Type).kind_ = (param_1->super_Type).kind_;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Opaque_00b1afe0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (param_1->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + (param_1->name_)._M_string_length);
  return;
}

Assistant:

Opaque(const Opaque&) = default;